

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

Utest * __thiscall
TEST_SimpleString_copyInBufferNormal_TestShell::createTest
          (TEST_SimpleString_copyInBufferNormal_TestShell *this)

{
  TEST_SimpleString_copyInBufferNormal_Test *this_00;
  
  this_00 = (TEST_SimpleString_copyInBufferNormal_Test *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                         ,0x21b);
  TEST_SimpleString_copyInBufferNormal_Test::TEST_SimpleString_copyInBufferNormal_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(SimpleString, copyInBufferNormal)
{
    SimpleString str("Hello World");
    size_t bufferSize = str.size()+1;
    char* buffer = (char*) PlatformSpecificMalloc(bufferSize);
    str.copyToBuffer(buffer, bufferSize);
    STRCMP_EQUAL(str.asCharString(), buffer);
    PlatformSpecificFree(buffer);
}